

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  cv_status cVar1;
  bool bVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,(mutex_type *)(this + 0x38));
  do {
    if (*(long *)this == 0) goto LAB_00224d7b;
    cVar1 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((condition_variable *)(this + 8),&local_30,tp);
  } while (cVar1 != timeout);
  if (*(long *)this == 0) {
LAB_00224d7b:
    rwlock::ReaderPrefer::acquire_wlock((state *)this);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar2;
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp)
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    RwLockPolicy::before_wait_wlock(state_);
    while (RwLockPolicy::wait_wlock(state_)) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (!RwLockPolicy::wait_wlock(state_))  // re-check predicate
          break;
        RwLockPolicy::after_wait_wlock(state_);
        return false;
      }
    }
    RwLockPolicy::after_wait_wlock(state_);
    RwLockPolicy::acquire_wlock(state_);
    return true;
  }